

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O2

void __thiscall
transwarp::detail::task_impl_base<$1a67ba37$>::add_listener_all
          (task_impl_base<_1a67ba37_> *this,shared_ptr<transwarp::listener> *listener)

{
  add_listener_visitor local_38;
  undefined8 local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  ensure_task_not_running(this);
  local_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38.listener_.super___shared_ptr<transwarp::listener,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (listener->super___shared_ptr<transwarp::listener,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38.listener_.super___shared_ptr<transwarp::listener,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (listener->super___shared_ptr<transwarp::listener,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (listener->super___shared_ptr<transwarp::listener,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (listener->super___shared_ptr<transwarp::listener,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  visit_depth_all<transwarp::detail::add_listener_visitor>(this,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.listener_.super___shared_ptr<transwarp::listener,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void add_listener_all(std::shared_ptr<transwarp::listener> listener) override {
        ensure_task_not_running();
        transwarp::detail::add_listener_visitor visitor(std::move(listener));
        visit_depth_all(visitor);
    }